

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrixCursor.h
# Opt level: O0

this_t * __thiscall
ZXing::BitMatrixCursor<ZXing::PointT<double>_>::movedBy
          (BitMatrixCursor<ZXing::PointT<double>_> *this,PointT<double> o)

{
  PointT<double> d;
  BitMatrix *in_RSI;
  this_t *in_RDI;
  PointT<double> PVar1;
  BitMatrixCursor<ZXing::PointT<double>_> *this_00;
  
  this_00 = *(BitMatrixCursor<ZXing::PointT<double>_> **)in_RSI;
  PVar1 = operator+<double,_double>((PointT<double> *)in_RDI,(PointT<double> *)in_RDI);
  d.y = PVar1.x;
  d.x = PVar1.y;
  BitMatrixCursor(this_00,in_RSI,
                  *(PointT<double> *)
                   &(in_RSI->_bits).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,d);
  return in_RDI;
}

Assistant:

this_t movedBy(POINT o) const noexcept { return {*img, p + o, d}; }